

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::Ogre::OgreImporter::CanRead
          (OgreImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  undefined7 in_register_00000009;
  char *tokens [1];
  string local_68;
  string local_48;
  
  if ((int)CONCAT71(in_register_00000009,checkSig) == 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,".mesh.xml","");
    bVar2 = EndsWith(pFile,&local_68,false);
    bVar3 = true;
    if (!bVar2) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,".mesh","");
      bVar3 = EndsWith(pFile,&local_48,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
  }
  else {
    paVar1 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,".mesh.xml","");
    bVar2 = EndsWith(pFile,&local_68,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (bVar2) {
      local_68._M_dataplus._M_p = "<mesh>";
      bVar2 = BaseImporter::SearchFileHeaderForToken
                        (pIOHandler,pFile,(char **)&local_68,1,200,false,false);
      return bVar2;
    }
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,".mesh","");
    bVar3 = EndsWith(pFile,&local_68,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool OgreImporter::CanRead(const std::string &pFile, Assimp::IOSystem *pIOHandler, bool checkSig) const
{
    if (!checkSig) {
        return EndsWith(pFile, ".mesh.xml", false) || EndsWith(pFile, ".mesh", false);
    }

    if (EndsWith(pFile, ".mesh.xml", false))
    {
        const char* tokens[] = { "<mesh>" };
        return SearchFileHeaderForToken(pIOHandler, pFile, tokens, 1);
    }
    else
    {
        /// @todo Read and validate first header chunk?
        return EndsWith(pFile, ".mesh", false);
    }
}